

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPermit,_1UL>::Construct
                   (DB *db,LIST *params)

{
  IfcControl *this;
  
  this = (IfcControl *)operator_new(0x128);
  *(undefined ***)&this[1].super_IfcObject.field_0x18 = &PTR__Object_008d12a0;
  *(undefined8 *)&this[1].super_IfcObject.field_0x20 = 0;
  *(char **)&this[1].super_IfcObject.field_0x28 = "IfcPermit";
  Assimp::IFC::Schema_2x3::IfcControl::IfcControl(this,&PTR_construction_vtable_24__009034b8);
  *(undefined8 *)&this->field_0xe8 = 0;
  *(undefined ***)&this->super_IfcObject = &PTR__IfcPermit_009033d8;
  *(undefined ***)&this[1].super_IfcObject.field_0x18 = &PTR__IfcPermit_009034a0;
  *(undefined ***)&(this->super_IfcObject).field_0x88 = &PTR__IfcPermit_00903400;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcPermit_00903428;
  *(undefined ***)&(this->super_IfcObject).field_0xd0 = &PTR__IfcPermit_00903450;
  *(undefined ***)&(this->super_IfcObject).field_0xe0 = &PTR__IfcPermit_00903478;
  *(undefined1 **)&this->field_0xf0 = &this[1].super_IfcObject.field_0x8;
  *(undefined8 *)&this[1].super_IfcObject = 0;
  this[1].super_IfcObject.field_0x8 = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcObject>(db,params,(IfcObject *)this);
  return (Object *)
         (&(this->super_IfcObject).field_0x0 + *(long *)(*(long *)&this->super_IfcObject + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }